

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcLaborResource::~IfcLaborResource(IfcLaborResource *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this->super_IfcConstructionResource = 0x8347e8;
  *(undefined8 *)&this->field_0x1b0 = 0x8348d8;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x88 = 0x834810;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x98 = 0x834838;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0xd0 = 0x834860;
  (this->super_IfcConstructionResource).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>._vptr_ObjectHelper =
       (_func_int **)0x834888;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x178 = 0x8348b0;
  puVar1 = *(undefined1 **)&(this->super_IfcConstructionResource).field_0x188;
  if (puVar1 != &this->field_0x198) {
    operator_delete(puVar1,*(long *)&this->field_0x198 + 1);
  }
  IfcConstructionResource::~IfcConstructionResource
            (&this->super_IfcConstructionResource,&PTR_construction_vtable_24__008348f0);
  operator_delete(this,0x1c8);
  return;
}

Assistant:

IfcLaborResource() : Object("IfcLaborResource") {}